

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoop::removeChannel(EventLoop *this,Channel *channel)

{
  EventLoop *pEVar1;
  pointer pPVar2;
  bool local_41;
  __normal_iterator<sznet::net::Channel_**,_std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>_>
  local_38;
  Channel **local_30;
  __normal_iterator<sznet::net::Channel_**,_std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>_>
  local_28;
  __normal_iterator<sznet::net::Channel_**,_std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>_>
  local_20;
  Channel *local_18;
  Channel *channel_local;
  EventLoop *this_local;
  
  local_18 = channel;
  channel_local = (Channel *)this;
  pEVar1 = Channel::ownerLoop(channel);
  if (pEVar1 != this) {
    __assert_fail("channel->ownerLoop() == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                  ,0xd0,"void sznet::net::EventLoop::removeChannel(Channel *)");
  }
  assertInLoopThread(this);
  if ((this->m_eventHandling & 1U) != 0) {
    local_41 = true;
    if (this->m_currentActiveChannel != local_18) {
      local_28._M_current =
           (Channel **)
           std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::begin
                     (&this->m_activeChannels);
      local_30 = (Channel **)
                 std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::end
                           (&this->m_activeChannels);
      local_20 = std::
                 find<__gnu_cxx::__normal_iterator<sznet::net::Channel**,std::vector<sznet::net::Channel*,std::allocator<sznet::net::Channel*>>>,sznet::net::Channel*>
                           (local_28,(__normal_iterator<sznet::net::Channel_**,_std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>_>
                                      )local_30,&local_18);
      local_38._M_current =
           (Channel **)
           std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::end
                     (&this->m_activeChannels);
      local_41 = __gnu_cxx::operator==(&local_20,&local_38);
    }
    if (local_41 == false) {
      __assert_fail("m_currentActiveChannel == channel || std::find(m_activeChannels.begin(), m_activeChannels.end(), channel) == m_activeChannels.end()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                    ,0xd4,"void sznet::net::EventLoop::removeChannel(Channel *)");
    }
  }
  pPVar2 = std::unique_ptr<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>::operator->
                     (&this->m_poller);
  (*pPVar2->_vptr_Poller[4])(pPVar2,local_18);
  return;
}

Assistant:

void EventLoop::removeChannel(Channel* channel)
{
	assert(channel->ownerLoop() == this);
	assertInLoopThread();
	if (m_eventHandling)
	{
		assert(m_currentActiveChannel == channel || std::find(m_activeChannels.begin(), m_activeChannels.end(), channel) == m_activeChannels.end());
	}
	m_poller->removeChannel(channel);
}